

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_negation_range
                (bitset_container_t *src,int range_start,int range_end,container_t **dst)

{
  bool bVar1;
  int iVar2;
  bitset_container_t *bitset;
  array_container_t *paVar3;
  bitset_container_t *t;
  container_t **dst_local;
  int range_end_local;
  int range_start_local;
  bitset_container_t *src_local;
  
  bitset = bitset_container_clone(src);
  bitset_flip_range(bitset->words,range_start,range_end);
  iVar2 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar2;
  bVar1 = bitset->cardinality < 0x1001;
  if (bVar1) {
    paVar3 = array_container_from_bitset(bitset);
    *dst = paVar3;
    bitset_container_free(bitset);
  }
  else {
    *dst = bitset;
  }
  src_local._7_1_ = !bVar1;
  return src_local._7_1_;
}

Assistant:

bool bitset_container_negation_range(
    const bitset_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    // TODO maybe consider density-based estimate
    // and sometimes build result directly as array, with
    // conversion back to bitset if wrong.  Or determine
    // actual result cardinality, then go directly for the known final cont.

    // keep computation using bitsets as long as possible.
    bitset_container_t *t = bitset_container_clone(src);
    bitset_flip_range(t->words, (uint32_t)range_start, (uint32_t)range_end);
    t->cardinality = bitset_container_compute_cardinality(t);

    if (t->cardinality > DEFAULT_MAX_SIZE) {
        *dst = t;
        return true;
    } else {
        *dst = array_container_from_bitset(t);
        bitset_container_free(t);
        return false;
    }
}